

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPage::setButtonText(QWizardPage *this,WizardButton which,QString *text)

{
  long lVar1;
  QAbstractButton *this_00;
  QWizardPage *pQVar2;
  long in_FS_OFFSET;
  QWizardPage *local_30;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (QWizardPage *)CONCAT44(local_30._4_4_,which);
  QMap<int,_QString>::insert
            ((QMap<int,_QString> *)(*(long *)&(this->super_QWidget).field_0x8 + 0x310),
             (int *)&local_30,text);
  lVar1 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if (lVar1 != 0) {
    lVar1 = *(long *)(lVar1 + 8);
    local_24 = *(int *)(lVar1 + 0x340);
    local_30 = (QWizardPage *)0x0;
    pQVar2 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0),&local_24,&local_30);
    if ((pQVar2 == this) &&
       (this_00 = *(QAbstractButton **)
                   (*(long *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 8) +
                    0x420 + (long)which * 8), this_00 != (QAbstractButton *)0x0)) {
      QAbstractButton::setText(this_00,text);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::setButtonText(QWizard::WizardButton which, const QString &text)
{
    Q_D(QWizardPage);
    d->buttonCustomTexts.insert(which, text);
    if (wizard() && wizard()->currentPage() == this && wizard()->d_func()->btns[which])
        wizard()->d_func()->btns[which]->setText(text);
}